

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O1

bool __thiscall
OPNMIDIplay::realTime_NoteOn(OPNMIDIplay *this,uint8_t channel,uint8_t note,uint8_t velocity)

{
  _Rb_tree_header *p_Var1;
  OPN_Operator *pOVar2;
  Phys *pPVar3;
  double dVar4;
  char cVar5;
  OPN2 *pOVar6;
  pointer pMVar7;
  DebugMessageHook p_Var8;
  pointer pOVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint16_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  MIDIchannel *pMVar20;
  byte bVar21;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar22;
  notes_iterator nVar23;
  int64_t iVar24;
  Phys *pPVar25;
  long lVar26;
  bool bVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  undefined7 in_register_00000009;
  long *plVar31;
  long *plVar32;
  char *pcVar33;
  Slot *pSVar34;
  _Base_ptr p_Var35;
  pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *ppVar36;
  Slot *pSVar37;
  _Base_ptr p_Var38;
  OpnTimbre *pOVar39;
  ulong uVar40;
  uint uVar41;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  OpnInstMeta *pOVar42;
  long lVar43;
  uint ccount;
  Bank *pBVar44;
  byte bVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar52;
  size_t bank;
  int32_t adlchannel [2];
  Phys voices [2];
  value_type_conflict5 local_d8;
  undefined8 local_d0;
  MIDIchannel *local_c8;
  ulong local_c0;
  int local_b4;
  OpnInstMeta *local_b0;
  OPNMIDIplay *local_a8;
  uint local_9c;
  ulong local_98;
  size_t local_90;
  OPN2 *local_88;
  Phys *local_80;
  Phys local_78;
  undefined2 local_56;
  undefined1 local_54 [16];
  undefined1 local_44 [16];
  
  uVar28 = (uint)CONCAT71(in_register_00000009,velocity);
  pOVar6 = (this->m_synth).m_p;
  bVar45 = 0x7f;
  if (note < 0x7f) {
    bVar45 = note;
  }
  if ((uVar28 != 0) && (pOVar6->m_musicMode == MODE_RSXX)) {
    pMVar7 = (this->m_midiChannels).
             super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar36 = (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)
              (pMVar7->_padding2 + (ulong)((uint)channel * 0x140) + 0x3b);
    for (ppVar22 = *(pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> **)
                    (pMVar7->_padding2 + (ulong)((uint)channel * 0x140) + 0x2b);
        (nVar23.cell_ = ppVar36, ppVar22 != ppVar36 &&
        (nVar23.cell_ = ppVar22, (ppVar22->value).note != bVar45));
        ppVar22 = (ppVar22->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next) {
    }
    ppVar22 = ((nVar23.cell_)->super_pl_basic_cell<OPNMIDIplay::MIDIchannel::NoteInfo>).next;
    if (ppVar22 != (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0) {
      pOVar42 = ((nVar23.cell_)->value).ains;
      if (pOVar42 == (OpnInstMeta *)0x0) {
        iVar29 = 0;
      }
      else {
        iVar29 = (int)pOVar42->midiVelocityOffset;
      }
      uVar41 = 1;
      if (1 < (int)(iVar29 + uVar28)) {
        uVar41 = iVar29 + uVar28;
      }
      uVar28 = 0x7f;
      if ((int)uVar41 < 0x7f) {
        uVar28 = uVar41;
      }
      ((nVar23.cell_)->value).vol = (uint8_t)uVar28;
      if (pOVar42 != (OpnInstMeta *)0x0) {
        noteUpdate(this,(ulong)channel,nVar23,4,-1);
      }
    }
    if (ppVar22 != (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0) {
      return false;
    }
  }
  bVar21 = channel & 0xf;
  if ((ulong)channel <=
      (ulong)(((long)(this->m_midiChannels).
                     super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_midiChannels).
                     super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x3333333333333333)) {
    bVar21 = channel;
  }
  uVar40 = (ulong)bVar21;
  local_c0 = (ulong)bVar45;
  noteOff(this,uVar40,bVar45,(char)uVar28 != '\0');
  if ((char)uVar28 != '\0') {
    pMVar7 = (this->m_midiChannels).
             super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar47 = (ulong)((uint)bVar21 * 0x140);
    bVar27 = (bool)((bVar21 & 0xf) == 9 | pMVar7->_padding2[uVar47 + 0xffffffffffffffff] & 1U);
    local_d8 = 0;
    bVar45 = pMVar7->noteAftertouch[uVar47 + 0xffffffffffffffe5];
    if ((bVar45 != 0 || pMVar7->noteAftertouch[uVar47 + 0xffffffffffffffe4] != '\0') &&
       (local_d8 = (ulong)bVar45 << 8, (this->m_synthMode & 1) == 0)) {
      local_d8 = (value_type_conflict5)
                 CONCAT11(bVar45,pMVar7->noteAftertouch[uVar47 + 0xffffffffffffffe4]);
    }
    local_c8 = (MIDIchannel *)(pMVar7->noteAftertouch + uVar47 + -0x28);
    uVar46 = (ulong)pMVar7->noteAftertouch[uVar47 + 0xffffffffffffffe6];
    if (bVar27 != false) {
      lVar43 = 0;
      if ((this->m_synthMode & 2) != 0) {
        lVar43 = (ulong)(local_c8->bank_msb == '~') << 7;
      }
      local_d8 = lVar43 + (ulong)pMVar7->noteAftertouch[uVar47 + 0xffffffffffffffe6];
      uVar46 = local_c0;
    }
    if (bVar27 != false) {
      local_d8 = local_d8 + 0x8000;
    }
    if ((local_d8 & 0xffffffffffff7fff) == 0) {
      pOVar42 = &OPN2::m_emptyInstrument;
      bVar48 = false;
      pBVar44 = (Bank *)0x0;
    }
    else {
      plVar31 = (long *)((ulong)(((uint)(local_d8 >> 1) & 0x80 | (uint)local_d8 & 0x7f) << 3) +
                        (long)(pOVar6->m_insBanks).m_buckets.
                              super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                              .m_p);
      do {
        plVar31 = (long *)*plVar31;
        plVar32 = (long *)0;
        if (plVar31 == (long *)0x0) break;
        plVar32 = plVar31;
      } while (plVar31[2] != local_d8);
      pBVar44 = (Bank *)0x0;
      if (plVar31 != (long *)0x0 || plVar32 != (long *)0x0) {
        pBVar44 = (Bank *)((long)plVar32 + 0x18);
      }
      bVar48 = plVar31 == (long *)0x0 && plVar32 == (long *)0x0;
      if (plVar31 == (long *)0x0 && plVar32 == (long *)0x0) {
        pOVar42 = &OPN2::m_emptyInstrument;
      }
      else {
        pOVar42 = pBVar44->ins + uVar46;
      }
    }
    if (((pOVar42->flags & 2) != 0) && ((local_d8 & 0xffffffffffffff80) != local_d8)) {
      plVar31 = (long *)((ulong)(((uint)local_d8 & 0x100) << 2) +
                        (long)(pOVar6->m_insBanks).m_buckets.
                              super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                              .m_p);
      do {
        plVar31 = (long *)*plVar31;
        plVar32 = (long *)0;
        if (plVar31 == (long *)0x0) break;
        plVar32 = plVar31;
      } while (plVar31[2] != (local_d8 & 0xffffffffffffff80));
      if (plVar31 != (long *)0x0 || plVar32 != (long *)0x0) {
        pBVar44 = (Bank *)((long)plVar32 + 0x18);
      }
      bVar48 = pBVar44 == (Bank *)0x0;
      if (!bVar48) {
        pOVar42 = pBVar44->ins + uVar46;
      }
    }
    if ((bVar48) && ((this->hooks).onDebugMessage != (DebugMessageHook)0x0)) {
      this_00 = &this->caugh_missing_banks_melodic;
      if (bVar27 != false) {
        this_00 = &this->caugh_missing_banks_percussion;
      }
      local_b0 = pOVar42;
      pVar52 = std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::_M_insert_unique(&this_00->_M_t,&local_d8);
      pOVar42 = local_b0;
      if (((undefined1  [16])pVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar33 = "melodic";
        if (bVar27 != false) {
          pcVar33 = "percussion";
        }
        (*(this->hooks).onDebugMessage)
                  ((this->hooks).onDebugMessage_userData,
                   "[%i] Playing missing %s MIDI bank %i (patch %i)",(ulong)bVar21,pcVar33,
                   local_d8 & 0xffffffffffff7fff,uVar46);
        pOVar42 = local_b0;
      }
    }
    if ((pOVar42->flags & 2) != 0) {
      pSVar34 = (Slot *)(pOVar6->m_insBanks).m_buckets.
                        super_AdlMIDI_SPtr<BasicBankMap<OPN2::Bank>::Slot_*,_ADLMIDI_DefaultArrayDelete<BasicBankMap<OPN2::Bank>::Slot_*>_>
                        .m_p;
      do {
        pSVar34 = pSVar34->next;
        pSVar37 = (Slot *)0x0;
        if (pSVar34 == (Slot *)0x0) break;
        pSVar37 = pSVar34;
      } while ((pSVar34->value).first != (ulong)((uint)local_d8 & 0x8000));
      if (pSVar34 != (Slot *)0x0 || pSVar37 != (Slot *)0x0) {
        pBVar44 = &(pSVar37->value).second;
      }
      if (pBVar44 != (Bank *)0x0) {
        pOVar42 = pBVar44->ins + uVar46;
      }
    }
    iVar30 = (int)pOVar42->midiVelocityOffset + (uVar28 & 0xff);
    iVar29 = 1;
    if (1 < iVar30) {
      iVar29 = iVar30;
    }
    local_b4 = 0x7f;
    if (iVar29 < 0x7f) {
      local_b4 = iVar29;
    }
    if ((local_d8 != 0 && bVar27 == false) && ((pOVar42->flags & 2) != 0)) {
      p_Var8 = (this->hooks).onDebugMessage;
      if (p_Var8 != (DebugMessageHook)0x0) {
        p_Var1 = &(this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header;
        p_Var38 = (this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var35 = &p_Var1->_M_header;
        for (; p_Var38 != (_Base_ptr)0x0;
            p_Var38 = (&p_Var38->_M_left)[*(ulong *)(p_Var38 + 1) < uVar46]) {
          if (*(ulong *)(p_Var38 + 1) >= uVar46) {
            p_Var35 = p_Var38;
          }
        }
        p_Var38 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var35 != p_Var1) &&
           (p_Var38 = p_Var35, uVar46 < *(ulong *)(p_Var35 + 1))) {
          p_Var38 = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)p_Var38 == p_Var1) {
          (*p_Var8)((this->hooks).onDebugMessage_userData,
                    "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u",uVar40,
                    (ulong)local_c8->patch,uVar46);
          local_78.chip_chan = (uint16_t)uVar46;
          local_78.ains.OPS[0].data[0] = (uint8_t)(uVar46 >> 0x10);
          local_78.ains.OPS[0].data[1] = (uint8_t)(uVar46 >> 0x18);
          local_78.ains.OPS[0].data[2] = (uint8_t)(uVar46 >> 0x20);
          local_78.ains.OPS[0].data[3] = (uint8_t)(uVar46 >> 0x28);
          local_78.ains.OPS[0].data[4] = (uint8_t)(uVar46 >> 0x30);
          local_78.ains.OPS[0].data[5] = (uint8_t)(uVar46 >> 0x38);
          std::
          _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
          ::_M_insert_unique(&(this->caugh_missing_instruments)._M_t,
                             (value_type_conflict5 *)&local_78);
        }
      }
      local_d8 = 0;
      uVar46 = (ulong)local_c8->patch;
    }
    bVar45 = pOVar42->drumTone;
    local_9c = bVar45 - 0x80;
    if (-1 < (char)bVar45) {
      local_9c = (uint)bVar45;
    }
    if (bVar45 == 0) {
      local_9c = (uint)local_c0;
    }
    local_78.chip_chan = 0;
    uVar10 = *(undefined8 *)pOVar42->op[0].OPS;
    local_78.ains.OPS._8_8_ = *(undefined8 *)(pOVar42->op[0].OPS[1].data + 1);
    local_78.ains.OPS._16_8_ = *(undefined8 *)(pOVar42->op[0].OPS[2].data + 2);
    local_78.ains._24_8_ = *(undefined8 *)(pOVar42->op[0].OPS[3].data + 3);
    local_78.ains.OPS[0].data[0] = (uint8_t)uVar10;
    local_78.ains.OPS[0].data[1] = (uint8_t)((ulong)uVar10 >> 8);
    local_78.ains.OPS[0].data[2] = (uint8_t)((ulong)uVar10 >> 0x10);
    local_78.ains.OPS[0].data[3] = (uint8_t)((ulong)uVar10 >> 0x18);
    local_78.ains.OPS[0].data[4] = (uint8_t)((ulong)uVar10 >> 0x20);
    local_78.ains.OPS[0].data[5] = (uint8_t)((ulong)uVar10 >> 0x28);
    local_78.ains.OPS[0].data[6] = (uint8_t)((ulong)uVar10 >> 0x30);
    local_78.ains.OPS[1].data[0] = (uint8_t)((ulong)uVar10 >> 0x38);
    local_56 = 0;
    local_54 = pOVar42->op[1].OPS[0].data[0];
    local_44 = *(undefined1 (*) [16])(pOVar42->op[1].OPS[2].data + 2);
    bVar45 = pOVar42->flags & 2;
    p_Var8 = (this->hooks).onDebugMessage;
    local_b0 = pOVar42;
    if (p_Var8 != (DebugMessageHook)0x0) {
      p_Var1 = &(this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header;
      p_Var38 = (this->caugh_missing_instruments)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      p_Var35 = &p_Var1->_M_header;
      for (; p_Var38 != (_Base_ptr)0x0;
          p_Var38 = (&p_Var38->_M_left)[*(ulong *)(p_Var38 + 1) < uVar46]) {
        if (*(ulong *)(p_Var38 + 1) >= uVar46) {
          p_Var35 = p_Var38;
        }
      }
      p_Var38 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var35 != p_Var1) &&
         (p_Var38 = p_Var35, uVar46 < *(ulong *)(p_Var35 + 1))) {
        p_Var38 = &p_Var1->_M_header;
      }
      if (((_Rb_tree_header *)p_Var38 == p_Var1) && (bVar45 != 0)) {
        (*p_Var8)((this->hooks).onDebugMessage_userData,"[%i] Playing missing instrument %i",uVar40,
                  uVar46);
        local_d0 = uVar46;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_insert_unique(&(this->caugh_missing_instruments)._M_t,&local_d0);
      }
    }
    uVar47 = local_c0;
    pMVar20 = local_c8;
    if (bVar45 == 0) {
      local_d0 = 0xffffffffffffffff;
      lVar43 = 0;
      local_a8 = this;
      local_98 = uVar40;
      local_90 = uVar46;
      local_88 = pOVar6;
      do {
        iVar29 = (uint)local_d0;
        if (lVar43 == 1) {
          auVar51[0] = -(local_54[0] == local_78.ains.OPS[0].data[0]);
          auVar51[1] = -(local_54[1] == local_78.ains.OPS[0].data[1]);
          auVar51[2] = -(local_54[2] == local_78.ains.OPS[0].data[2]);
          auVar51[3] = -(local_54[3] == local_78.ains.OPS[0].data[3]);
          auVar51[4] = -(local_54[4] == local_78.ains.OPS[0].data[4]);
          auVar51[5] = -(local_54[5] == local_78.ains.OPS[0].data[5]);
          auVar51[6] = -(local_54[6] == local_78.ains.OPS[0].data[6]);
          auVar51[7] = -(local_54[7] == local_78.ains.OPS[1].data[0]);
          auVar51[8] = -(local_54[8] == local_78.ains.OPS[1].data[1]);
          auVar51[9] = -(local_54[9] == local_78.ains.OPS[1].data[2]);
          auVar51[10] = -(local_54[10] == local_78.ains.OPS[1].data[3]);
          auVar51[0xb] = -(local_54[0xb] == local_78.ains.OPS[1].data[4]);
          auVar51[0xc] = -(local_54[0xc] == local_78.ains.OPS[1].data[5]);
          auVar51[0xd] = -(local_54[0xd] == local_78.ains.OPS[1].data[6]);
          auVar51[0xe] = -(local_54[0xe] == local_78.ains.OPS[2].data[0]);
          auVar51[0xf] = -(local_54[0xf] == local_78.ains.OPS[2].data[1]);
          auVar50[0] = -(local_44[0] == local_78.ains.OPS[2].data[2]);
          auVar50[1] = -(local_44[1] == local_78.ains.OPS[2].data[3]);
          auVar50[2] = -(local_44[2] == local_78.ains.OPS[2].data[4]);
          auVar50[3] = -(local_44[3] == local_78.ains.OPS[2].data[5]);
          auVar50[4] = -(local_44[4] == local_78.ains.OPS[2].data[6]);
          auVar50[5] = -(local_44[5] == local_78.ains.OPS[3].data[0]);
          auVar50[6] = -(local_44[6] == local_78.ains.OPS[3].data[1]);
          auVar50[7] = -(local_44[7] == local_78.ains.OPS[3].data[2]);
          auVar50[8] = -(local_44[8] == local_78.ains.OPS[3].data[3]);
          auVar50[9] = -(local_44[9] == local_78.ains.OPS[3].data[4]);
          auVar50[10] = -(local_44[10] == local_78.ains.OPS[3].data[5]);
          auVar50[0xb] = -(local_44[0xb] == local_78.ains.OPS[3].data[6]);
          auVar50[0xc] = -(local_44[0xc] == local_78.ains.fbalg);
          auVar50[0xd] = -(local_44[0xd] == local_78.ains.lfosens);
          auVar50[0xe] = -(local_44[0xe] == (char)local_78.ains.noteOffset);
          auVar50[0xf] = -(local_44[0xf] == local_78.ains.noteOffset._1_1_);
          auVar50 = auVar50 & auVar51;
          if (((ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar50[0xf] >> 7) << 0xf) == 0xffff) ||
             ((uint)local_d0 == -1)) break;
        }
        uVar28 = local_88->m_numChannels;
        if ((ulong)uVar28 == 0) {
          uVar41 = 0xffffffff;
        }
        else {
          local_80 = &local_78 + lVar43;
          uVar47 = 0xffffffff;
          iVar30 = -0x7fffffff;
          uVar40 = 0;
          do {
            if (lVar43 != 1 || iVar29 != (int)uVar40) {
              iVar24 = calculateChipChannelGoodness(local_a8,uVar40,local_80);
              if (iVar30 < iVar24) {
                uVar47 = uVar40 & 0xffffffff;
              }
              if (iVar30 < iVar24) {
                iVar30 = (int)iVar24;
              }
            }
            uVar41 = (uint)uVar47;
            uVar40 = uVar40 + 1;
          } while (uVar28 != uVar40);
        }
        this = local_a8;
        if ((int)uVar41 < 0) {
          p_Var8 = (local_a8->hooks).onDebugMessage;
          if (p_Var8 != (DebugMessageHook)0x0) {
            (*p_Var8)((local_a8->hooks).onDebugMessage_userData,
                      "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",
                      local_d8,(ulong)local_c8->patch,local_c0,local_98);
          }
        }
        else {
          prepareChipChannelForNewNote(local_a8,(ulong)uVar41,&local_78 + lVar43);
          *(uint *)((long)&local_d0 + lVar43 * 4) = uVar41;
        }
        bVar48 = lVar43 == 0;
        lVar43 = lVar43 + 1;
      } while (bVar48);
      pMVar20 = local_c8;
      bVar48 = -1 < (int)((uint)local_d0 & local_d0._4_4_);
      if (bVar48) {
        iVar29 = local_b4;
        if (local_c8->softPedal == true) {
          fVar49 = floorf((float)(int)(char)local_b4 * 0.8);
          iVar29 = (int)fVar49;
        }
        uVar40 = local_c0;
        nVar23 = MIDIchannel::ensure_find_or_create_activenote(pMVar20,(uint)local_c0);
        ((nVar23.cell_)->value).vol = (uint8_t)iVar29;
        ((nVar23.cell_)->value).vibrato = pMVar20->noteAftertouch[uVar40];
        ((nVar23.cell_)->value).noteTone = (int16_t)local_9c;
        ((nVar23.cell_)->value).currentTone = (double)(int)local_9c;
        ((nVar23.cell_)->value).glideRate = INFINITY;
        ((nVar23.cell_)->value).midiins = local_90;
        ((nVar23.cell_)->value).isPercussion = bVar27;
        ((nVar23.cell_)->value).isBlank = false;
        ((nVar23.cell_)->value).isOnExtendedLifeTime = false;
        ((nVar23.cell_)->value).ttl = 0.0;
        ((nVar23.cell_)->value).ains = local_b0;
        ((nVar23.cell_)->value).chip_channels_count = 0;
        cVar5 = pMVar20->portamentoSource;
        dVar4 = pMVar20->portamentoRate;
        pMVar20->portamentoSource = (int8_t)uVar40;
        if ((byte)((bVar27 ^ 1U) & -1 < cVar5 & dVar4 < INFINITY & pMVar20->portamentoEnable) == 1)
        {
          ((nVar23.cell_)->value).currentTone = (double)(int)cVar5;
          ((nVar23.cell_)->value).glideRate = dVar4;
          pMVar20->gliding_note_count = pMVar20->gliding_note_count + 1;
        }
        if (bVar27 != false) {
          ((nVar23.cell_)->value).ttl = 0.03;
          pMVar20->extended_note_count = pMVar20->extended_note_count + 1;
        }
        pOVar39 = &local_78.ains;
        lVar43 = 0;
        do {
          iVar29 = *(int *)((long)&local_d0 + lVar43 * 4);
          if (-1 < iVar29) {
            pPVar25 = MIDIchannel::NoteInfo::phys_ensure_find_or_create
                                (&(nVar23.cell_)->value,(uint16_t)iVar29);
            uVar10 = *(undefined8 *)(pOVar39->OPS[1].data + 1);
            uVar11 = *(undefined8 *)(pOVar39->OPS[2].data + 2);
            uVar12 = *(undefined8 *)(pOVar39->OPS[3].data + 3);
            *(undefined8 *)(pPVar25->ains).OPS = *(undefined8 *)pOVar39->OPS;
            *(undefined8 *)((pPVar25->ains).OPS[1].data + 1) = uVar10;
            *(undefined8 *)((pPVar25->ains).OPS[2].data + 2) = uVar11;
            *(undefined8 *)((pPVar25->ains).OPS[3].data + 3) = uVar12;
          }
          lVar43 = lVar43 + 1;
          pOVar39 = (OpnTimbre *)((long)(pOVar39 + 1) + 2);
        } while (lVar43 == 1);
        noteUpdate(this,local_98,nVar23,0xf,-1);
        pPVar25 = &local_78;
        lVar43 = 0;
        do {
          lVar26 = (long)*(int *)((long)&local_d0 + lVar43 * 4);
          if (-1 < lVar26) {
            pOVar9 = (this->m_chipChannels).
                     super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pOVar9[lVar26].recent_ins.ains.noteOffset = (pPVar25->ains).noteOffset;
            uVar13 = pPVar25->chip_chan;
            uVar14 = (pPVar25->ains).OPS[0].data[0];
            uVar15 = (pPVar25->ains).OPS[0].data[1];
            uVar16 = (pPVar25->ains).OPS[0].data[2];
            uVar17 = (pPVar25->ains).OPS[0].data[3];
            uVar18 = (pPVar25->ains).OPS[0].data[4];
            uVar19 = (pPVar25->ains).OPS[0].data[5];
            uVar10 = *(undefined8 *)((pPVar25->ains).OPS[0].data + 6);
            uVar11 = *(undefined8 *)((pPVar25->ains).OPS[3].data + 1);
            pOVar2 = pOVar9[lVar26].recent_ins.ains.OPS + 2;
            *(undefined8 *)pOVar2 = *(undefined8 *)((pPVar25->ains).OPS + 2);
            *(undefined8 *)(pOVar2[1].data + 1) = uVar11;
            pPVar3 = &pOVar9[lVar26].recent_ins;
            pPVar3->chip_chan = uVar13;
            (pPVar3->ains).OPS[0].data[0] = uVar14;
            (pPVar3->ains).OPS[0].data[1] = uVar15;
            (pPVar3->ains).OPS[0].data[2] = uVar16;
            (pPVar3->ains).OPS[0].data[3] = uVar17;
            (pPVar3->ains).OPS[0].data[4] = uVar18;
            (pPVar3->ains).OPS[0].data[5] = uVar19;
            *(undefined8 *)((pPVar3->ains).OPS[0].data + 6) = uVar10;
            OpnChannel::addAge((this->m_chipChannels).
                               super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar26,0);
          }
          lVar43 = lVar43 + 1;
          pPVar25 = pPVar25 + 1;
        } while (lVar43 == 1);
        return bVar48;
      }
      return bVar48;
    }
    nVar23 = MIDIchannel::ensure_find_or_create_activenote(local_c8,(uint)local_c0);
    ((nVar23.cell_)->value).isBlank = true;
    ((nVar23.cell_)->value).isOnExtendedLifeTime = false;
    ((nVar23.cell_)->value).chip_channels_count = 0;
    ((nVar23.cell_)->value).ttl = 0.0;
    ((nVar23.cell_)->value).ains = (OpnInstMeta *)0x0;
    pMVar20->portamentoSource = (int8_t)uVar47;
  }
  return false;
}

Assistant:

bool OPNMIDIplay::realTime_NoteOn(uint8_t channel, uint8_t note, uint8_t velocity)
{
    Synth &synth = *m_synth;

    if(note >= 127)
        note = 127;

    if((synth.m_musicMode == Synth::MODE_RSXX) && (velocity != 0))
    {
        // Check if this is just a note after-touch
        MIDIchannel::notes_iterator i = m_midiChannels[channel].find_activenote(note);
        if(!i.is_end())
        {
            MIDIchannel::NoteInfo &ni = i->value;
            const int veloffset = ni.ains ? ni.ains->midiVelocityOffset : 0;
            velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));
            ni.vol = velocity;
            if(ni.ains)
                noteUpdate(channel, i, Upd_Volume);
            return false;
        }
    }

    if(static_cast<size_t>(channel) > m_midiChannels.size())
        channel = channel % 16;
    noteOff(channel, note, velocity != 0);
    // On Note on, Keyoff the note first, just in case keyoff
    // was omitted; this fixes Dance of sugar-plum fairy
    // by Microsoft. Now that we've done a Keyoff,
    // check if we still need to do a Keyon.
    // vol=0 and event 8x are both Keyoff-only.
    if(velocity == 0)
        return false;

    MIDIchannel &midiChan = m_midiChannels[channel];

    size_t midiins = midiChan.patch;
    bool isPercussion = (channel % 16 == 9) || midiChan.is_xg_percussion;

    size_t bank = 0;
    if(midiChan.bank_msb || midiChan.bank_lsb)
    {
        if((m_synthMode & Mode_GS) != 0) //in GS mode ignore LSB
            bank = (midiChan.bank_msb * 256);
        else
            bank = (midiChan.bank_msb * 256) + midiChan.bank_lsb;
    }

    if(isPercussion)
    {
        // == XG bank numbers ==
        // 0x7E00 - XG "SFX Kits" SFX1/SFX2 channel (16128 signed decimal)
        // 0x7F00 - XG "Drum Kits" Percussion channel (16256 signed decimal)

        // MIDI instrument defines the patch:
        if((m_synthMode & Mode_XG) != 0)
        {
            // Let XG SFX1/SFX2 bank will go in 128...255 range of LSB in WOPN file)
            // Let XG Percussion bank will use (0...127 LSB range in WOPN file)

            // Choose: SFX or Drum Kits
            bank = midiins + ((midiChan.bank_msb == 0x7E) ? 128 : 0);
        }
        else
        {
            bank = midiins;
        }
        midiins = note; // Percussion instrument
    }

    if(isPercussion)
        bank += Synth::PercussionTag;

    const OpnInstMeta *ains = &Synth::m_emptyInstrument;

    //Set bank bank
    const Synth::Bank *bnk = NULL;
    bool caughtMissingBank = false;
    if((bank & ~static_cast<uint16_t>(Synth::PercussionTag)) > 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
        else
            caughtMissingBank = true;
    }

    //Or fall back to bank ignoring LSB (GS/XG)
    if(ains->flags & OpnInstMeta::Flag_NoSound)
    {
        size_t fallback = bank & ~(size_t)0x7F;
        if(fallback != bank)
        {
            Synth::BankMap::iterator b = synth.m_insBanks.find(fallback);
            caughtMissingBank = false;
            if(b != synth.m_insBanks.end())
                bnk = &b->second;
            if(bnk)
                ains = &bnk->ins[midiins];
            else
                caughtMissingBank = true;
        }
    }

    if(caughtMissingBank && hooks.onDebugMessage)
    {
        std::set<size_t> &missing = (isPercussion) ?
                                    caugh_missing_banks_percussion : caugh_missing_banks_melodic;
        const char *text = (isPercussion) ?
                           "percussion" : "melodic";
        if(missing.insert(bank).second)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                 "[%i] Playing missing %s MIDI bank %i (patch %i)",
                                 channel, text, (bank & ~static_cast<uint16_t>(Synth::PercussionTag)), midiins);
        }
    }

    //Or fall back to first bank
    if((ains->flags & OpnInstMeta::Flag_NoSound) != 0)
    {
        Synth::BankMap::iterator b = synth.m_insBanks.find(bank & Synth::PercussionTag);
        if(b != synth.m_insBanks.end())
            bnk = &b->second;
        if(bnk)
            ains = &bnk->ins[midiins];
    }

    const int veloffset = ains->midiVelocityOffset;
    velocity = static_cast<uint8_t>(std::min(127, std::max(1, static_cast<int>(velocity) + veloffset)));

    int32_t tone = note;
    if(!isPercussion && (bank > 0)) // For non-zero banks
    {
        if(ains->flags & OpnInstMeta::Flag_NoSound)
        {
            if(hooks.onDebugMessage)
            {
                if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)))
                {
                    hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Caught a blank instrument %i (offset %i) in the MIDI bank %u", channel, midiChan.patch, midiins, bank);
                    caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
                }
            }
            bank = 0;
            midiins = midiChan.patch;
        }
    }

    if(ains->drumTone)
    {
        if(ains->drumTone >= 128)
            tone = ains->drumTone - 128;
        else
            tone = ains->drumTone;
    }

    MIDIchannel::NoteInfo::Phys voices[MIDIchannel::NoteInfo::MaxNumPhysChans] = {
        {0, ains->op[0], /*false*/},
        {0, ains->op[1], /*pseudo_4op*/},
    };
    //bool pseudo_4op = ains.flags & opnInstMeta::Flag_Pseudo8op;
    //if((opn.AdlPercussionMode == 1) && PercussionMap[midiins & 0xFF]) i[1] = i[0];

    bool isBlankNote = (ains->flags & OpnInstMeta::Flag_NoSound) != 0;

    if(hooks.onDebugMessage)
    {
        if(!caugh_missing_instruments.count(static_cast<uint8_t>(midiins)) && isBlankNote)
        {
            hooks.onDebugMessage(hooks.onDebugMessage_userData, "[%i] Playing missing instrument %i", channel, midiins);
            caugh_missing_instruments.insert(static_cast<uint8_t>(midiins));
        }
    }

    if(isBlankNote)
    {
        // Don't even try to play the blank instrument! But, insert the dummy note.
        MIDIchannel::notes_iterator i = midiChan.ensure_find_or_create_activenote(note);
        MIDIchannel::NoteInfo &dummy = i->value;
        dummy.isBlank = true;
        dummy.isOnExtendedLifeTime = false;
        dummy.ttl = 0;
        dummy.ains = NULL;
        dummy.chip_channels_count = 0;
        // Record the last note on MIDI channel as source of portamento
        midiChan.portamentoSource = static_cast<int8_t>(note);
        return false;
    }

    // Allocate OPN2 channel (the physical sound channel for the note)
    int32_t adlchannel[MIDIchannel::NoteInfo::MaxNumPhysChans] = { -1, -1 };

    for(uint32_t ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        if(ccount == 1)
        {
            if(voices[0] == voices[1])
                break; // No secondary channel
            if(adlchannel[0] == -1)
                break; // No secondary if primary failed
        }

        int32_t c = -1;
        int32_t bs = -0x7FFFFFFFl;

        for(size_t a = 0; a < static_cast<size_t>(synth.m_numChannels); ++a)
        {
            if(ccount == 1 && static_cast<int32_t>(a) == adlchannel[0]) continue;
            // ^ Don't use the same channel for primary&secondary
            // ===== Kept for future pseudo-8-op mode
            //if(voices[0] == voices[1] || pseudo_4op)
            //{
            //    // Only use regular channels
            //    uint8_t expected_mode = 0;
            //    if(opn.AdlPercussionMode == 1)
            //    {
            //        if(cmf_percussion_mode)
            //            expected_mode = MidCh < 11 ? 0 : (3 + MidCh - 11); // CMF
            //        else
            //            expected_mode = PercussionMap[midiins & 0xFF];
            //    }
            //    if(opn.four_op_category[a] != expected_mode)
            //        continue;
            //}
            int64_t s = calculateChipChannelGoodness(a, voices[ccount]);
            if(s > bs)
            {
                bs = static_cast<int32_t>(s);    // Best candidate wins
                c = static_cast<int32_t>(a);
            }
        }

        if(c < 0)
        {
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData,
                                     "ignored unplaceable note [bank %i, inst %i, note %i, MIDI channel %i]",
                                     bank, midiChan.patch, note, channel);
            continue; // Could not play this note. Ignore it.
        }

        prepareChipChannelForNewNote(static_cast<size_t>(c), voices[ccount]);
        adlchannel[ccount] = c;
    }

    if(adlchannel[0] < 0 && adlchannel[1] < 0)
    {
        // The note could not be played, at all.
        return false;
    }

    //if(hooks.onDebugMessage)
    //    hooks.onDebugMessage(hooks.onDebugMessage_userData, "i1=%d:%d, i2=%d:%d", i[0],adlchannel[0], i[1],adlchannel[1]);

    if(midiChan.softPedal) // Apply Soft Pedal level reducing
        velocity = static_cast<uint8_t>(std::floor(static_cast<float>(velocity) * 0.8f));

    // Allocate active note for MIDI channel
    MIDIchannel::notes_iterator ir = midiChan.ensure_find_or_create_activenote(note);
    MIDIchannel::NoteInfo &ni = ir->value;
    ni.vol     = velocity;
    ni.vibrato = midiChan.noteAftertouch[note];
    ni.noteTone = static_cast<int16_t>(tone);
    ni.currentTone = tone;
    ni.glideRate = HUGE_VAL;
    ni.midiins = midiins;
    ni.isPercussion = isPercussion;
    ni.isBlank = isBlankNote;
    ni.isOnExtendedLifeTime = false;
    ni.ttl = 0;
    ni.ains = ains;
    ni.chip_channels_count = 0;

    int8_t currentPortamentoSource = midiChan.portamentoSource;
    double currentPortamentoRate = midiChan.portamentoRate;
    bool portamentoEnable =
        midiChan.portamentoEnable && currentPortamentoRate != HUGE_VAL && !isPercussion;
    // Record the last note on MIDI channel as source of portamento
    midiChan.portamentoSource = static_cast<int8_t>(note);
    // midiChan.portamentoSource = portamentoEnable ? (int8_t)note : (int8_t)-1;

    // Enable gliding on portamento note
    if (portamentoEnable && currentPortamentoSource >= 0)
    {
        ni.currentTone = currentPortamentoSource;
        ni.glideRate = currentPortamentoRate;
        ++midiChan.gliding_note_count;
    }

    // Enable life time extension on percussion note
    if (isPercussion)
    {
        ni.ttl = drum_note_min_time;
        ++midiChan.extended_note_count;
    }

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        uint16_t chipChan = static_cast<uint16_t>(adlchannel[ccount]);
        ni.phys_ensure_find_or_create(chipChan)->assign(voices[ccount]);
    }

    noteUpdate(channel, ir, Upd_All | Upd_Patch);

    for(unsigned ccount = 0; ccount < MIDIchannel::NoteInfo::MaxNumPhysChans; ++ccount)
    {
        int32_t c = adlchannel[ccount];
        if(c < 0)
            continue;
        m_chipChannels[c].recent_ins = voices[ccount];
        m_chipChannels[c].addAge(0);
    }

    return true;
}